

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitX86.c
# Opt level: O0

void sysbvm_jit_x86_callAbsoluteNon64InlineConstant(sysbvm_bytecodeJit_t *jit,void *functionPointer)

{
  sysbvm_bytecodeJitRelocation_t relocation_00;
  size_t sVar1;
  sysbvm_bytecodeJitRelocation_t relocation;
  size_t relocationOffset;
  size_t sStack_20;
  uint8_t instruction [6];
  size_t constantOffset;
  void *functionPointer_local;
  sysbvm_bytecodeJit_t *jit_local;
  
  constantOffset = (size_t)functionPointer;
  functionPointer_local = jit;
  sStack_20 = sysbvm_bytecodeJit_addConstantsBytes(jit,8,(uint8_t *)&constantOffset);
  relocationOffset._2_1_ = 0xff;
  relocationOffset._3_1_ = sysbvm_jit_x86_modRM('\x05','\x02','\0');
  relocationOffset._4_1_ = 0;
  relocationOffset._5_1_ = 0;
  relocationOffset._6_1_ = 0;
  relocationOffset._7_1_ = 0;
  sVar1 = sysbvm_bytecodeJit_addBytes
                    ((sysbvm_bytecodeJit_t *)functionPointer_local,6,
                     (uint8_t *)((long)&relocationOffset + 2));
  relocation_00._8_8_ = (ulong)relocation.offset._4_4_ << 0x20;
  relocation_00.offset = sVar1 - 4;
  relocation_00.value = sStack_20;
  relocation_00.addend = -4;
  sysbvm_bytecodeJit_addRelocation((sysbvm_bytecodeJit_t *)functionPointer_local,relocation_00);
  return;
}

Assistant:

static void sysbvm_jit_x86_callAbsoluteNon64InlineConstant(sysbvm_bytecodeJit_t *jit, void *functionPointer)
{
    size_t constantOffset = sysbvm_bytecodeJit_addConstantsBytes(jit, sizeof(functionPointer), (uint8_t*)&functionPointer);
    uint8_t instruction[] = {
        0xFF,
        sysbvm_jit_x86_modRM(5, 2, 0),
        0x00, 0x00, 0x00, 0x00,
    };

    size_t relocationOffset = sysbvm_bytecodeJit_addBytes(jit, sizeof(instruction), instruction) - 4;

    sysbvm_bytecodeJitRelocation_t relocation = {
        .offset = relocationOffset,
        .type = SYSBVM_BYTECODE_JIT_RELOCATION_RELATIVE32,
        .value = constantOffset,
        .addend = -4
    };
    sysbvm_bytecodeJit_addRelocation(jit, relocation);
}